

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int connectionIsBusy(sqlite3 *db)

{
  Btree *p;
  int iVar1;
  Btree *pBt;
  int j;
  sqlite3 *db_local;
  
  if (db->pVdbe == (Vdbe *)0x0) {
    for (pBt._4_4_ = 0; pBt._4_4_ < db->nDb; pBt._4_4_ = pBt._4_4_ + 1) {
      p = db->aDb[pBt._4_4_].pBt;
      if ((p != (Btree *)0x0) && (iVar1 = sqlite3BtreeIsInBackup(p), iVar1 != 0)) {
        return 1;
      }
    }
    db_local._4_4_ = 0;
  }
  else {
    db_local._4_4_ = 1;
  }
  return db_local._4_4_;
}

Assistant:

static int connectionIsBusy(sqlite3 *db){
  int j;
  assert( sqlite3_mutex_held(db->mutex) );
  if( db->pVdbe ) return 1;
  for(j=0; j<db->nDb; j++){
    Btree *pBt = db->aDb[j].pBt;
    if( pBt && sqlite3BtreeIsInBackup(pBt) ) return 1;
  }
  return 0;
}